

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O0

bool __thiscall duckdb::IEJoinUnion::NextRow(IEJoinUnion *this)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  pointer pSVar5;
  idx_t iVar6;
  idx_t in_RDI;
  value_type p2;
  value_type pos;
  SBIterator *in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  SBIterator *in_stack_ffffffffffffffe0;
  
  while( true ) {
    if (*(ulong *)(in_RDI + 0xb8) <= *(ulong *)(in_RDI + 0xc0)) {
      return false;
    }
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffffd0,
                        (size_type)in_stack_ffffffffffffffc8);
    vVar1 = *pvVar3;
    pvVar4 = vector<long,_true>::operator[]
                       ((vector<long,_true> *)in_stack_ffffffffffffffd0,
                        (size_type)in_stack_ffffffffffffffc8);
    *(value_type *)(in_RDI + 0xf0) = *pvVar4;
    if (-1 < *(long *)(in_RDI + 0xf0)) break;
    *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + 1;
  }
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
            ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
             in_stack_ffffffffffffffd0);
  SBIterator::SetIndex(in_stack_ffffffffffffffe0,in_RDI);
  while( true ) {
    pSVar5 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                         *)in_stack_ffffffffffffffd0);
    iVar6 = SBIterator::GetIndex(pSVar5);
    if (*(ulong *)(in_RDI + 0xb8) <= iVar6) break;
    in_stack_ffffffffffffffd0 =
         unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                   ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *
                    )in_stack_ffffffffffffffd0);
    unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
              ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
               in_stack_ffffffffffffffd0);
    bVar2 = SBIterator::Compare(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    in_stack_ffffffffffffffc8 = (SBIterator *)(in_RDI + 0x28);
    pSVar5 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                         *)in_stack_ffffffffffffffd0);
    SBIterator::GetIndex(pSVar5);
    vector<unsigned_long,_true>::operator[]
              ((vector<unsigned_long,_true> *)in_stack_ffffffffffffffd0,
               (size_type)in_stack_ffffffffffffffc8);
    pvVar4 = vector<long,_true>::operator[]
                       ((vector<long,_true> *)in_stack_ffffffffffffffd0,
                        (size_type)in_stack_ffffffffffffffc8);
    if (*pvVar4 < 0) {
      TemplatedValidityMask<unsigned_long>::SetValid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffd0,
                 (idx_t)in_stack_ffffffffffffffc8);
      TemplatedValidityMask<unsigned_long>::SetValid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffd0,
                 (idx_t)in_stack_ffffffffffffffc8);
    }
    unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
              ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
               in_stack_ffffffffffffffd0);
    SBIterator::operator++(in_stack_ffffffffffffffd0);
  }
  *(value_type *)(in_RDI + 200) = vVar1;
  return true;
}

Assistant:

bool IEJoinUnion::NextRow() {
	for (; i < n; ++i) {
		// 12. pos ← P[i]
		auto pos = p[i];
		lrid = li[pos];
		if (lrid < 0) {
			continue;
		}

		// 16. B[pos] ← 1
		op2->SetIndex(i);
		for (; off2->GetIndex() < n; ++(*off2)) {
			if (!off2->Compare(*op2)) {
				break;
			}
			const auto p2 = p[off2->GetIndex()];
			if (li[p2] < 0) {
				// Only mark rhs matches.
				bit_mask.SetValid(p2);
				bloom_filter.SetValid(p2 / BLOOM_CHUNK_BITS);
			}
		}

		// 9.  if (op1 ∈ {≤,≥} and op2 ∈ {≤,≥}) eqOff = 0
		// 10. else eqOff = 1
		// No, because there could be more than one equal value.
		// Find the leftmost off1 where L1[pos] op1 L1[off1..n]
		// These are the rows that satisfy the op1 condition
		// and that is where we should start scanning B from
		j = pos;

		return true;
	}
	return false;
}